

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::ContactConstraint::calcPositionError
          (ContactConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *errSysUpd,
          ConstraintCache *cache,bool updateKinematics)

{
  long lVar1;
  uint i;
  ulong __n;
  double dVar2;
  reference rVar3;
  Matrix<double,_3,_1,_0,_3,_1> local_60;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_48;
  
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_60,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  local_48.m_rhs = &(this->groundPoint).super_Vector3d;
  local_48.m_lhs = &local_60;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)(cache + 0x50),&local_48);
  lVar1 = 0;
  for (__n = 0; __n < (this->super_Constraint).sizeOfConstraint; __n = __n + 1) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&(this->super_Constraint).positionConstraint,__n);
    if ((*rVar3._M_p & rVar3._M_mask) == 0) {
      dVar2 = 0.0;
    }
    else {
      dVar2 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(cache + 0x50),
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                    (*(long *)&(this->super_Constraint).field_0xd8 + lVar1));
    }
    (errSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [(this->super_Constraint).rowInSystem + (int)__n] = dVar2;
    lVar1 = lVar1 + 0x18;
  }
  return;
}

Assistant:

void ContactConstraint::calcPositionError(Model &model,
                                                      const double time,
                                                      const Math::VectorNd &Q,
                                                      Math::VectorNd &errSysUpd,
                                                      ConstraintCache &cache,
                                                      bool updateKinematics)
{
  cache.vec3A = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics)  - groundPoint;
  for(unsigned int i = 0; i < sizeOfConstraint; ++i){
    if(positionConstraint[i]){
      errSysUpd[rowInSystem+i] = cache.vec3A.dot( T[i] );
    }else{
      errSysUpd[rowInSystem+i] = 0.;
    }
  }
}